

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sniff_csv.cpp
# Opt level: O3

string * __thiscall
duckdb::FormatOptions_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,char opt)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 0) {
    pcVar1 = anon_var_dwarf_6372561 + 9;
    pcVar2 = anon_var_dwarf_6372561 + 9;
  }
  else {
    if ((int)this != 0x27) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pcVar2 = "\'\'";
    pcVar1 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string FormatOptions(char opt) {
	if (opt == '\'') {
		return "''";
	}
	if (opt == '\0') {
		return "";
	}
	string result;
	result += opt;
	return result;
}